

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

lysp_when ** lysp_node_when_p(lysp_node *node)

{
  ushort uVar1;
  uint16_t *puVar2;
  
  if (node == (lysp_node *)0x0) {
    return (lysp_when **)0x0;
  }
  uVar1 = node->nodetype;
  puVar2 = (uint16_t *)0x0;
  if (uVar1 < 0x20) {
    switch(uVar1) {
    case 1:
    case 2:
    case 4:
    case 8:
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      goto switchD_00161e85_caseD_3;
    default:
      if (uVar1 != 0x10) {
        return (lysp_when **)0x0;
      }
    }
  }
  else if (uVar1 < 0x80) {
    if ((uVar1 != 0x20) && (uVar1 != 0x60)) {
      return (lysp_when **)0x0;
    }
  }
  else if (uVar1 != 0x80) {
    if (uVar1 == 0x800) {
      return (lysp_when **)&node[1].next;
    }
    if (uVar1 != 0x8000) {
      return (lysp_when **)0x0;
    }
  }
  puVar2 = &node[1].nodetype;
switchD_00161e85_caseD_3:
  return (lysp_when **)puVar2;
}

Assistant:

struct lysp_when **
lysp_node_when_p(const struct lysp_node *node)
{
    if (!node) {
        return NULL;
    }

    switch (node->nodetype) {
    case LYS_CONTAINER:
        return &((struct lysp_node_container *)node)->when;
    case LYS_CHOICE:
        return &((struct lysp_node_choice *)node)->when;
    case LYS_LEAF:
        return &((struct lysp_node_leaf *)node)->when;
    case LYS_LEAFLIST:
        return &((struct lysp_node_leaflist *)node)->when;
    case LYS_LIST:
        return &((struct lysp_node_list *)node)->when;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        return &((struct lysp_node_anydata *)node)->when;
    case LYS_CASE:
        return &((struct lysp_node_case *)node)->when;
    case LYS_USES:
        return &((struct lysp_node_uses *)node)->when;
    case LYS_AUGMENT:
        return &((struct lysp_node_augment *)node)->when;
    default:
        return NULL;
    }
}